

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

int VectorMismatch_C(uint32_t *array1,uint32_t *array2,int length)

{
  bool bVar1;
  int match_len;
  int length_local;
  uint32_t *array2_local;
  uint32_t *array1_local;
  
  match_len = 0;
  while( true ) {
    bVar1 = false;
    if (match_len < length) {
      bVar1 = array1[match_len] == array2[match_len];
    }
    if (!bVar1) break;
    match_len = match_len + 1;
  }
  return match_len;
}

Assistant:

static int VectorMismatch_C(const uint32_t* const array1,
                            const uint32_t* const array2, int length) {
  int match_len = 0;

  while (match_len < length && array1[match_len] == array2[match_len]) {
    ++match_len;
  }
  return match_len;
}